

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::arg_impl(QString *__return_storage_ptr__,QString *this,QAnyStringView a,int fieldWidth,
                 QChar fillChar)

{
  QStringView s;
  QStringView s_00;
  QStringView arg;
  QStringView larg;
  uint uVar1;
  storage_type *psVar2;
  char16_t *pcVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  long in_FS_OFFSET;
  QByteArrayView in;
  undefined1 *local_278;
  undefined1 *puStack_270;
  undefined1 *local_268;
  undefined1 *puStack_260;
  QVarLengthArray<char16_t,_256LL> local_250;
  long local_38;
  
  in.m_size = a.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_268 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_260 = &DAT_aaaaaaaaaaaaaaaa;
  local_278 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_270 = &DAT_aaaaaaaaaaaaaaaa;
  s.m_data = (this->d).ptr;
  s.m_size = (this->d).size;
  psVar2 = (storage_type *)a.m_size;
  findArgEscapes((ArgEscapeData *)&local_278,s);
  if (puStack_270 == (undefined1 *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0014eb7f;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
  }
  else {
    memset(&local_250,0xaa,0x200);
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a = 0x100;
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s = 0;
    uVar1 = (uint)a.m_size & 3;
    pcVar3 = (char16_t *)((ulong)a.m_size >> 2);
    aVar4 = in.m_size;
    local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr = &local_250;
    if (uVar1 != 2) {
      if (uVar1 == 1) {
        QVarLengthArray<char16_t,_256LL>::resize(&local_250,(qsizetype)pcVar3);
        qt_from_latin1((char16_t *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr,
                       in.m_size,(size_t)pcVar3);
        pcVar3 = (char16_t *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s;
        aVar4.m_data = local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
      }
      else {
        QVarLengthArray<char16_t,_256LL>::resize(&local_250,(qsizetype)pcVar3);
        aVar4.m_data = local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
        in.m_data = psVar2;
        pcVar3 = QUtf8::convertToUnicode
                           ((QUtf8 *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr,
                            pcVar3,in);
        pcVar3 = (char16_t *)((long)pcVar3 - (long)aVar4.m_data >> 1);
      }
    }
    s_00.m_data = (this->d).ptr;
    s_00.m_size = (this->d).size;
    arg.m_size = (qsizetype)pcVar3;
    arg.m_data = (storage_type_conflict *)aVar4.m_data;
    larg.m_size = (qsizetype)pcVar3;
    larg.m_data = (storage_type_conflict *)aVar4.m_data;
    replaceArgEscapes(__return_storage_ptr__,s_00,(ArgEscapeData *)&local_278,(long)fieldWidth,arg,
                      larg,fillChar);
    QVarLengthArray<char16_t,_256LL>::~QVarLengthArray(&local_250);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0014eb7f:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::arg_impl(QAnyStringView a, int fieldWidth, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (Q_UNLIKELY(d.occurrences == 0)) {
        qWarning("QString::arg: Argument missing: \"%ls\", \"%ls\"", qUtf16Printable(*this),
                  qUtf16Printable(a.toString()));
        return *this;
    }
    struct {
        QVarLengthArray<char16_t> out;
        QStringView operator()(QStringView in) noexcept { return in; }
        QStringView operator()(QLatin1StringView in)
        {
            out.resize(in.size());
            qt_from_latin1(out.data(), in.data(), size_t(in.size()));
            return out;
        }
        QStringView operator()(QUtf8StringView in)
        {
            out.resize(in.size());
            return QStringView{out.data(), QUtf8::convertToUnicode(out.data(), in)};
        }
    } convert;

    QStringView sv = a.visit(std::ref(convert));
    return replaceArgEscapes(*this, d, fieldWidth, sv, sv, fillChar);
}